

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O1

REF_STATUS ref_geom_ghost(REF_GEOM ref_geom,REF_NODE ref_node)

{
  int iVar1;
  REF_MPI ref_mpi;
  REF_GLOB *pRVar2;
  REF_INT *pRVar3;
  REF_DBL *pRVar4;
  REF_ADJ_ITEM pRVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  int *__s;
  REF_INT *send_size;
  long lVar9;
  REF_INT *pRVar10;
  void *pvVar11;
  ulong uVar12;
  long lVar13;
  undefined8 uVar14;
  REF_STATUS RVar15;
  char *pcVar16;
  int iVar17;
  ulong uVar18;
  size_t sVar19;
  int *piVar20;
  REF_INT local;
  REF_INT degree;
  REF_INT descr [6];
  uint local_e8;
  REF_INT local_dc;
  void *local_d8;
  REF_INT *local_d0;
  int *local_c8;
  ulong local_c0;
  void *local_b8;
  void *local_b0;
  REF_INT *local_a8;
  REF_GEOM local_a0;
  void *local_98;
  void *local_90;
  void *local_88;
  void *local_80;
  ulong local_78;
  int *local_70;
  int local_64;
  void *local_60;
  ulong local_58;
  REF_INT *local_50;
  REF_INT local_48 [6];
  
  ref_mpi = ref_node->ref_mpi;
  if ((long)ref_mpi->n < 2) {
    return 0;
  }
  sVar19 = (long)ref_mpi->n << 2;
  __s = (int *)malloc(sVar19);
  if (__s == (int *)0x0) {
    piVar20 = (int *)0x0;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xe6a,
           "ref_geom_ghost","malloc a_next of REF_INT NULL");
  }
  else {
    memset(__s,0,sVar19);
    piVar20 = __s;
  }
  RVar15 = 2;
  if (__s == (int *)0x0) {
    return 2;
  }
  iVar8 = ref_mpi->n;
  local_a0 = ref_geom;
  local_70 = piVar20;
  if ((long)iVar8 < 0) {
    bVar6 = false;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xe6b,
           "ref_geom_ghost","malloc b_next of REF_INT negative");
    local_e8 = 1;
  }
  else {
    sVar19 = (long)iVar8 * 4;
    local_c8 = (int *)malloc(sVar19);
    if (local_c8 == (int *)0x0) {
      local_c8 = (int *)0x0;
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xe6b,
             "ref_geom_ghost","malloc b_next of REF_INT NULL");
      local_e8 = 2;
      bVar6 = false;
    }
    else {
      bVar6 = true;
      if (iVar8 != 0) {
        memset(local_c8,0,sVar19);
      }
      local_e8 = 2;
    }
  }
  if (!bVar6) {
    return local_e8;
  }
  if ((long)ref_mpi->n < 0) {
    local_e8 = 1;
    pcVar16 = "malloc a_nnode of REF_INT negative";
LAB_00167ca1:
    bVar6 = false;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xe6c,
           "ref_geom_ghost",pcVar16);
    send_size = (REF_INT *)0x0;
  }
  else {
    send_size = (REF_INT *)malloc((long)ref_mpi->n << 2);
    if (send_size == (REF_INT *)0x0) {
      local_e8 = 2;
      pcVar16 = "malloc a_nnode of REF_INT NULL";
      goto LAB_00167ca1;
    }
    bVar6 = true;
    if (0 < ref_mpi->n) {
      lVar9 = 0;
      do {
        send_size[lVar9] = 0;
        lVar9 = lVar9 + 1;
      } while (lVar9 < ref_mpi->n);
    }
  }
  if (!bVar6) {
    return local_e8;
  }
  if ((long)ref_mpi->n < 0) {
    local_e8 = 1;
    pcVar16 = "malloc b_nnode of REF_INT negative";
LAB_00167d35:
    bVar6 = false;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xe6d,
           "ref_geom_ghost",pcVar16);
    pRVar10 = (REF_INT *)0x0;
  }
  else {
    pRVar10 = (REF_INT *)malloc((long)ref_mpi->n << 2);
    if (pRVar10 == (REF_INT *)0x0) {
      local_e8 = 2;
      pcVar16 = "malloc b_nnode of REF_INT NULL";
      goto LAB_00167d35;
    }
    bVar6 = true;
    if (0 < ref_mpi->n) {
      lVar9 = 0;
      do {
        pRVar10[lVar9] = 0;
        lVar9 = lVar9 + 1;
      } while (lVar9 < ref_mpi->n);
    }
  }
  if (!bVar6) {
    return local_e8;
  }
  if ((long)ref_mpi->n < 0) {
    local_e8 = 1;
    pcVar16 = "malloc a_ngeom of REF_INT negative";
LAB_00167dbc:
    bVar6 = false;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xe6e,
           "ref_geom_ghost",pcVar16);
    local_a8 = (REF_INT *)0x0;
  }
  else {
    local_a8 = (REF_INT *)malloc((long)ref_mpi->n << 2);
    if (local_a8 == (REF_INT *)0x0) {
      local_e8 = 2;
      pcVar16 = "malloc a_ngeom of REF_INT NULL";
      goto LAB_00167dbc;
    }
    bVar6 = true;
    if (0 < ref_mpi->n) {
      lVar9 = 0;
      do {
        local_a8[lVar9] = 0;
        lVar9 = lVar9 + 1;
      } while (lVar9 < ref_mpi->n);
    }
  }
  if (!bVar6) {
    return local_e8;
  }
  if ((long)ref_mpi->n < 0) {
    local_e8 = 1;
    pcVar16 = "malloc b_ngeom of REF_INT negative";
LAB_00167e47:
    bVar6 = false;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xe6f,
           "ref_geom_ghost",pcVar16);
    local_d0 = (REF_INT *)0x0;
  }
  else {
    local_d0 = (REF_INT *)malloc((long)ref_mpi->n << 2);
    if (local_d0 == (REF_INT *)0x0) {
      local_e8 = 2;
      pcVar16 = "malloc b_ngeom of REF_INT NULL";
      goto LAB_00167e47;
    }
    bVar6 = true;
    if (0 < ref_mpi->n) {
      lVar9 = 0;
      do {
        local_d0[lVar9] = 0;
        lVar9 = lVar9 + 1;
      } while (lVar9 < ref_mpi->n);
    }
  }
  if (!bVar6) {
    return local_e8;
  }
  iVar8 = ref_node->max;
  if (0 < (long)iVar8) {
    pRVar2 = ref_node->global;
    lVar9 = 0;
    do {
      if ((-1 < pRVar2[lVar9]) && (ref_mpi->id != ref_node->part[lVar9])) {
        send_size[ref_node->part[lVar9]] = send_size[ref_node->part[lVar9]] + 1;
      }
      lVar9 = lVar9 + 1;
    } while (iVar8 != lVar9);
  }
  uVar7 = ref_mpi_alltoall(ref_mpi,send_size,pRVar10,1);
  if (uVar7 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xe78,
           "ref_geom_ghost",(ulong)uVar7,"alltoall nnodes");
    return uVar7;
  }
  iVar8 = ref_mpi->n;
  lVar9 = (long)iVar8;
  if (lVar9 < 1) {
    uVar7 = 0;
  }
  else {
    lVar13 = 0;
    uVar7 = 0;
    do {
      uVar7 = uVar7 + send_size[lVar13];
      lVar13 = lVar13 + 1;
    } while (lVar9 != lVar13);
  }
  if ((int)uVar7 < 0) {
    pcVar16 = "malloc a_global of REF_GLOB negative";
    uVar14 = 0xe7c;
LAB_00167fac:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar14,
           "ref_geom_ghost",pcVar16);
    RVar15 = 1;
  }
  else {
    local_88 = (void *)(ulong)uVar7;
    pvVar11 = malloc((long)local_88 * 8);
    if (pvVar11 == (void *)0x0) {
      pcVar16 = "malloc a_global of REF_GLOB NULL";
      uVar14 = 0xe7c;
    }
    else {
      local_60 = pvVar11;
      local_88 = malloc((long)local_88 << 2);
      if (local_88 == (void *)0x0) {
        pcVar16 = "malloc a_part of REF_INT NULL";
        uVar14 = 0xe7d;
      }
      else {
        if (iVar8 < 1) {
          pvVar11 = (void *)0x0;
        }
        else {
          lVar13 = 0;
          pvVar11 = (void *)0x0;
          do {
            pvVar11 = (void *)(ulong)(uint)((int)pvVar11 + pRVar10[lVar13]);
            lVar13 = lVar13 + 1;
          } while (lVar9 != lVar13);
        }
        if ((int)pvVar11 < 0) {
          pcVar16 = "malloc b_global of REF_GLOB negative";
          uVar14 = 0xe81;
          goto LAB_00167fac;
        }
        local_c0 = CONCAT44(local_c0._4_4_,(int)pvVar11);
        local_b8 = pvVar11;
        local_90 = malloc((long)pvVar11 * 8);
        if (local_90 == (void *)0x0) {
          pcVar16 = "malloc b_global of REF_GLOB NULL";
          uVar14 = 0xe81;
        }
        else {
          local_b8 = malloc((long)local_b8 << 2);
          pvVar11 = local_88;
          if (local_b8 == (void *)0x0) {
            pcVar16 = "malloc b_part of REF_INT NULL";
            uVar14 = 0xe82;
          }
          else {
            *local_70 = 0;
            if (1 < iVar8) {
              iVar8 = *local_70;
              lVar13 = 0;
              do {
                iVar8 = iVar8 + send_size[lVar13];
                local_70[lVar13 + 1] = iVar8;
                lVar13 = lVar13 + 1;
              } while (lVar9 + -1 != lVar13);
            }
            iVar8 = ref_node->max;
            if (0 < (long)iVar8) {
              pRVar2 = ref_node->global;
              lVar9 = 0;
              do {
                if (-1 < pRVar2[lVar9]) {
                  iVar17 = ref_mpi->id;
                  pRVar3 = ref_node->part;
                  iVar1 = pRVar3[lVar9];
                  if (iVar17 != iVar1) {
                    iVar1 = local_70[iVar1];
                    *(REF_GLOB *)((long)local_60 + (long)iVar1 * 8) = pRVar2[lVar9];
                    *(int *)((long)local_88 + (long)iVar1 * 4) = iVar17;
                    local_70[pRVar3[lVar9]] = local_70[pRVar3[lVar9]] + 1;
                  }
                }
                lVar9 = lVar9 + 1;
              } while (iVar8 != lVar9);
            }
            uVar7 = ref_mpi_alltoallv(ref_mpi,local_60,send_size,local_90,pRVar10,1,2);
            if (uVar7 != 0) {
              local_d8 = (void *)CONCAT44(local_d8._4_4_,uVar7);
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0xe94,"ref_geom_ghost",(ulong)uVar7,"alltoallv global");
              local_e8 = (uint)local_d8;
              uVar7 = (uint)local_d8;
            }
            if (uVar7 != 0) {
              return local_e8;
            }
            local_50 = pRVar10;
            uVar7 = ref_mpi_alltoallv(ref_mpi,pvVar11,send_size,local_b8,pRVar10,1,1);
            if (uVar7 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0xe97,"ref_geom_ghost",(ulong)uVar7,"alltoallv global");
              return uVar7;
            }
            if ((int)local_c0 != 0) {
              local_b0 = (void *)0x1;
              if (1 < (int)local_c0) {
                local_b0 = (void *)(local_c0 & 0xffffffff);
              }
              uVar18 = 0;
              do {
                uVar7 = ref_node_local(ref_node,*(REF_GLOB *)((long)local_90 + uVar18 * 8),&local_dc
                                      );
                if (uVar7 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                         ,0xe9a,"ref_geom_ghost",(ulong)uVar7,"g2l");
                  return uVar7;
                }
                local_d8 = (void *)(long)*(int *)((long)local_b8 + uVar18 * 4);
                uVar7 = ref_adj_degree(local_a0->ref_adj,local_dc,&local_64);
                if (uVar7 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                         ,0xe9c,"ref_geom_ghost",(ulong)uVar7,"deg");
                  return uVar7;
                }
                local_d0[(long)local_d8] = local_d0[(long)local_d8] + local_64;
                uVar18 = uVar18 + 1;
              } while (local_b0 != (void *)uVar18);
            }
            uVar7 = ref_mpi_alltoall(ref_mpi,local_d0,local_a8,1);
            if (uVar7 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0xea3,"ref_geom_ghost",(ulong)uVar7,"alltoall ngeoms");
              return uVar7;
            }
            iVar8 = ref_mpi->n;
            lVar9 = (long)iVar8;
            if (lVar9 < 1) {
              local_78 = 0;
            }
            else {
              lVar13 = 0;
              local_78 = 0;
              do {
                local_78 = (ulong)(uint)((int)local_78 + local_a8[lVar13]);
                lVar13 = lVar13 + 1;
              } while (lVar9 != lVar13);
            }
            iVar17 = (int)local_78;
            if (iVar17 < 0) {
              pcVar16 = "malloc a_descr of REF_GLOB negative";
              uVar14 = 0xea7;
              goto LAB_00167fac;
            }
            local_98 = malloc((ulong)(uint)(iVar17 * 6) << 3);
            if (local_98 == (void *)0x0) {
              pcVar16 = "malloc a_descr of REF_GLOB NULL";
              uVar14 = 0xea7;
            }
            else {
              local_80 = malloc((ulong)(uint)(iVar17 * 2) << 3);
              if (local_80 == (void *)0x0) {
                pcVar16 = "malloc a_param of REF_DBL NULL";
                uVar14 = 0xea8;
              }
              else {
                if (iVar8 < 1) {
                  iVar17 = 0;
                }
                else {
                  lVar13 = 0;
                  iVar17 = 0;
                  do {
                    iVar17 = iVar17 + local_d0[lVar13];
                    lVar13 = lVar13 + 1;
                  } while (lVar9 != lVar13);
                }
                if (iVar17 < 0) {
                  pcVar16 = "malloc b_descr of REF_GLOB negative";
                  uVar14 = 0xeac;
                  goto LAB_00167fac;
                }
                local_d8 = malloc((ulong)(uint)(iVar17 * 6) << 3);
                if (local_d8 == (void *)0x0) {
                  pcVar16 = "malloc b_descr of REF_GLOB NULL";
                  uVar14 = 0xeac;
                }
                else {
                  local_b0 = malloc((ulong)(uint)(iVar17 * 2) << 3);
                  if (local_b0 != (void *)0x0) {
                    *local_c8 = 0;
                    if (1 < iVar8) {
                      iVar8 = *local_c8;
                      lVar13 = 0;
                      do {
                        iVar8 = iVar8 + local_d0[lVar13];
                        local_c8[lVar13 + 1] = iVar8;
                        lVar13 = lVar13 + 1;
                      } while (lVar9 + -1 != lVar13);
                    }
                    if ((int)local_c0 != 0) {
                      local_58 = 1;
                      if (1 < (int)local_c0) {
                        local_58 = local_c0 & 0xffffffff;
                      }
                      uVar18 = 0;
                      do {
                        uVar7 = ref_node_local(ref_node,*(REF_GLOB *)((long)local_90 + uVar18 * 8),
                                               &local_dc);
                        if (uVar7 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                 ,0xeb5,"ref_geom_ghost",(ulong)uVar7,"g2l");
                          return uVar7;
                        }
                        uVar12 = 0xffffffff;
                        if (-1 < (long)local_dc) {
                          uVar12 = 0xffffffff;
                          if (local_dc < local_a0->ref_adj->nnode) {
                            uVar12 = (ulong)(uint)local_a0->ref_adj->first[local_dc];
                          }
                        }
                        if ((int)uVar12 != -1) {
                          iVar8 = local_a0->ref_adj->item[(int)uVar12].ref;
                          local_c0 = (ulong)*(int *)((long)local_b8 + uVar18 * 4);
                          pRVar10 = local_a0->descr;
                          pRVar4 = local_a0->param;
                          pRVar5 = local_a0->ref_adj->item;
                          lVar9 = (long)local_c8[local_c0];
                          pvVar11 = (void *)(lVar9 * 0x30 + (long)local_d8);
                          do {
                            lVar13 = 0;
                            do {
                              *(long *)((long)pvVar11 + lVar13 * 8) =
                                   (long)pRVar10[iVar8 * 6 + lVar13];
                              lVar13 = lVar13 + 1;
                            } while (lVar13 != 6);
                            iVar17 = pRVar10[(long)(iVar8 * 6) + 5];
                            lVar13 = -1;
                            if (((-1 < (long)iVar17) && (iVar17 < ref_node->max)) &&
                               (lVar13 = ref_node->global[iVar17], lVar13 < 0)) {
                              lVar13 = -1;
                            }
                            *(long *)((long)local_d8 + lVar9 * 0x30 + 0x28) = lVar13;
                            *(REF_DBL *)((long)local_b0 + lVar9 * 0x10) = pRVar4[iVar8 * 2];
                            *(REF_DBL *)((long)local_b0 + lVar9 * 0x10 + 8) = pRVar4[iVar8 * 2 + 1];
                            iVar17 = pRVar5[(int)uVar12].next;
                            uVar12 = (ulong)iVar17;
                            if (uVar12 == 0xffffffffffffffff) {
                              iVar8 = -1;
                            }
                            else {
                              iVar8 = pRVar5[uVar12].ref;
                            }
                            lVar9 = lVar9 + 1;
                            pvVar11 = (void *)((long)pvVar11 + 0x30);
                          } while (iVar17 != -1);
                          local_c8[local_c0] = (int)lVar9;
                        }
                        uVar18 = uVar18 + 1;
                      } while (uVar18 != local_58);
                    }
                    uVar7 = ref_mpi_alltoallv(ref_mpi,local_d8,local_d0,local_98,local_a8,6,2);
                    if (uVar7 == 0) {
                      uVar7 = ref_mpi_alltoallv(ref_mpi,local_b0,local_d0,local_80,local_a8,2,3);
                      if (uVar7 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                               ,0xec9,"ref_geom_ghost",(ulong)uVar7,"alltoallv param");
                        return uVar7;
                      }
                      if ((int)local_78 != 0) {
                        uVar18 = 1;
                        if (1 < (int)local_78) {
                          uVar18 = local_78 & 0xffffffff;
                        }
                        uVar12 = 0;
                        pvVar11 = local_98;
                        do {
                          lVar9 = 0;
                          do {
                            local_48[lVar9] = *(REF_INT *)((long)pvVar11 + lVar9 * 8);
                            lVar9 = lVar9 + 1;
                          } while (lVar9 != 6);
                          uVar7 = ref_node_local(ref_node,*(REF_GLOB *)
                                                           ((long)local_98 + uVar12 * 0x30 + 0x28),
                                                 &local_dc);
                          if (uVar7 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                   ,0xed0,"ref_geom_ghost",(ulong)uVar7,"g2l");
                            return uVar7;
                          }
                          local_48[5] = local_dc;
                          uVar7 = ref_geom_add_with_descr
                                            (local_a0,local_48,
                                             (REF_DBL *)(uVar12 * 0x10 + (long)local_80));
                          if (uVar7 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                                   ,0xed3,"ref_geom_ghost",(ulong)uVar7,"add ghost");
                            return uVar7;
                          }
                          uVar12 = uVar12 + 1;
                          pvVar11 = (void *)((long)pvVar11 + 0x30);
                        } while (uVar12 != uVar18);
                      }
                      free(local_b0);
                      free(local_d8);
                      free(local_80);
                      free(local_98);
                      free(local_b8);
                      free(local_90);
                      free(local_88);
                      free(local_60);
                      free(local_d0);
                      free(local_a8);
                      free(local_50);
                      free(send_size);
                      free(local_c8);
                      free(local_70);
                      return 0;
                    }
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                           ,0xec6,"ref_geom_ghost",(ulong)uVar7,"alltoallv descr");
                    return uVar7;
                  }
                  pcVar16 = "malloc b_param of REF_DBL NULL";
                  uVar14 = 0xead;
                  local_b0 = (void *)0x0;
                }
              }
            }
          }
        }
      }
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar14,
           "ref_geom_ghost",pcVar16);
  }
  return RVar15;
}

Assistant:

REF_FCN REF_STATUS ref_geom_ghost(REF_GEOM ref_geom, REF_NODE ref_node) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT *a_nnode, *b_nnode;
  REF_INT a_nnode_total, b_nnode_total;
  REF_GLOB *a_global, *b_global;
  REF_INT *a_part, *b_part;
  REF_INT *a_ngeom, *b_ngeom;
  REF_INT a_ngeom_total, b_ngeom_total;
  REF_GLOB *a_descr, *b_descr;
  REF_GLOB global;
  REF_DBL *a_param, *b_param;
  REF_INT part, node, degree;
  REF_INT *a_next, *b_next;
  REF_INT local, item, geom, i;
  REF_INT descr[REF_GEOM_DESCR_SIZE];

  if (!ref_mpi_para(ref_mpi)) return REF_SUCCESS;

  ref_malloc_init(a_next, ref_mpi_n(ref_mpi), REF_INT, 0);
  ref_malloc_init(b_next, ref_mpi_n(ref_mpi), REF_INT, 0);
  ref_malloc_init(a_nnode, ref_mpi_n(ref_mpi), REF_INT, 0);
  ref_malloc_init(b_nnode, ref_mpi_n(ref_mpi), REF_INT, 0);
  ref_malloc_init(a_ngeom, ref_mpi_n(ref_mpi), REF_INT, 0);
  ref_malloc_init(b_ngeom, ref_mpi_n(ref_mpi), REF_INT, 0);

  each_ref_node_valid_node(ref_node, node) {
    if (ref_mpi_rank(ref_mpi) != ref_node_part(ref_node, node)) {
      a_nnode[ref_node_part(ref_node, node)]++;
    }
  }

  RSS(ref_mpi_alltoall(ref_mpi, a_nnode, b_nnode, REF_INT_TYPE),
      "alltoall nnodes");

  a_nnode_total = 0;
  each_ref_mpi_part(ref_mpi, part) a_nnode_total += a_nnode[part];
  ref_malloc(a_global, a_nnode_total, REF_GLOB);
  ref_malloc(a_part, a_nnode_total, REF_INT);

  b_nnode_total = 0;
  each_ref_mpi_part(ref_mpi, part) b_nnode_total += b_nnode[part];
  ref_malloc(b_global, b_nnode_total, REF_GLOB);
  ref_malloc(b_part, b_nnode_total, REF_INT);

  a_next[0] = 0;
  each_ref_mpi_worker(ref_mpi, part) {
    a_next[part] = a_next[part - 1] + a_nnode[part - 1];
  }

  each_ref_node_valid_node(ref_node, node) {
    if (ref_mpi_rank(ref_mpi) != ref_node_part(ref_node, node)) {
      part = ref_node_part(ref_node, node);
      a_global[a_next[part]] = ref_node_global(ref_node, node);
      a_part[a_next[part]] = ref_mpi_rank(ref_mpi);
      a_next[ref_node_part(ref_node, node)]++;
    }
  }

  RSS(ref_mpi_alltoallv(ref_mpi, a_global, a_nnode, b_global, b_nnode, 1,
                        REF_GLOB_TYPE),
      "alltoallv global");
  RSS(ref_mpi_alltoallv(ref_mpi, a_part, a_nnode, b_part, b_nnode, 1,
                        REF_INT_TYPE),
      "alltoallv global");

  for (node = 0; node < b_nnode_total; node++) {
    RSS(ref_node_local(ref_node, b_global[node], &local), "g2l");
    part = b_part[node];
    RSS(ref_adj_degree(ref_geom_adj(ref_geom), local, &degree), "deg");
    /* printf("%d: node %d global %d local %d part %d degree %d\n",
       ref_mpi_rank(ref_mpi), node,b_global[node], local, part, degree); */
    b_ngeom[part] += degree;
  }

  RSS(ref_mpi_alltoall(ref_mpi, b_ngeom, a_ngeom, REF_INT_TYPE),
      "alltoall ngeoms");

  a_ngeom_total = 0;
  each_ref_mpi_part(ref_mpi, part) a_ngeom_total += a_ngeom[part];
  ref_malloc(a_descr, REF_GEOM_DESCR_SIZE * a_ngeom_total, REF_GLOB);
  ref_malloc(a_param, 2 * a_ngeom_total, REF_DBL);

  b_ngeom_total = 0;
  each_ref_mpi_part(ref_mpi, part) b_ngeom_total += b_ngeom[part];
  ref_malloc(b_descr, REF_GEOM_DESCR_SIZE * b_ngeom_total, REF_GLOB);
  ref_malloc(b_param, 2 * b_ngeom_total, REF_DBL);

  b_next[0] = 0;
  each_ref_mpi_worker(ref_mpi, part) {
    b_next[part] = b_next[part - 1] + b_ngeom[part - 1];
  }

  for (node = 0; node < b_nnode_total; node++) {
    RSS(ref_node_local(ref_node, b_global[node], &local), "g2l");
    part = b_part[node];
    each_ref_geom_having_node(ref_geom, local, item, geom) {
      each_ref_descr(ref_geom, i) {
        b_descr[i + REF_GEOM_DESCR_SIZE * b_next[part]] =
            (REF_GLOB)ref_geom_descr(ref_geom, i, geom);
      }
      b_descr[REF_GEOM_DESCR_NODE + REF_GEOM_DESCR_SIZE * b_next[part]] =
          ref_node_global(ref_node, ref_geom_node(ref_geom, geom));
      b_param[0 + 2 * b_next[part]] = ref_geom_param(ref_geom, 0, geom);
      b_param[1 + 2 * b_next[part]] = ref_geom_param(ref_geom, 1, geom);
      b_next[part]++;
    }
  }

  RSS(ref_mpi_alltoallv(ref_mpi, b_descr, b_ngeom, a_descr, a_ngeom,
                        REF_GEOM_DESCR_SIZE, REF_GLOB_TYPE),
      "alltoallv descr");
  RSS(ref_mpi_alltoallv(ref_mpi, b_param, b_ngeom, a_param, a_ngeom, 2,
                        REF_DBL_TYPE),
      "alltoallv param");

  for (geom = 0; geom < a_ngeom_total; geom++) {
    each_ref_descr(ref_geom, i) {
      descr[i] = (REF_INT)a_descr[i + REF_GEOM_DESCR_SIZE * geom];
    }
    global = a_descr[REF_GEOM_DESCR_NODE + REF_GEOM_DESCR_SIZE * geom];
    RSS(ref_node_local(ref_node, global, &local), "g2l");
    descr[REF_GEOM_DESCR_NODE] = local;
    RSS(ref_geom_add_with_descr(ref_geom, descr, &(a_param[2 * geom])),
        "add ghost");
  }

  free(b_param);
  free(b_descr);
  free(a_param);
  free(a_descr);
  free(b_part);
  free(b_global);
  free(a_part);
  free(a_global);
  free(b_ngeom);
  free(a_ngeom);
  free(b_nnode);
  free(a_nnode);
  free(b_next);
  free(a_next);

  return REF_SUCCESS;
}